

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O1

int __thiscall lattice::supercell::init(supercell *this,EVP_PKEY_CTX *ctx)

{
  span_t *this_00;
  offset_t *this_01;
  offset_t *this_02;
  long *plVar1;
  long *plVar2;
  long *plVar3;
  pointer puVar4;
  iterator __position;
  undefined1 auVar5 [16];
  bool bVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  logic_error *this_03;
  undefined8 *puVar10;
  long *plVar11;
  long lVar12;
  code *pcVar13;
  size_type __new_size;
  undefined *puVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ActualDstType actualDst_2;
  ulong uVar19;
  long *plVar20;
  ActualDstType actualDst_1;
  Scalar SVar21;
  offset_t c;
  unsigned_long local_48;
  span_t *local_40;
  
  this_00 = &this->span_;
  lVar18 = *(long *)ctx;
  lVar7 = *(long *)(ctx + 8);
  lVar12 = *(long *)(ctx + 0x10);
  if (((this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       != lVar7) ||
     ((this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      != lVar12)) {
    if ((lVar12 != 0 && lVar7 != 0) &&
       (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar5 / SEXT816(lVar12),0) < lVar7)) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(8,ctx,SUB168(auVar5 % SEXT816(lVar12),0));
      *puVar10 = execv;
      __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<long,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<long,__1,__1,__1,_0> *)this_00,lVar12 * lVar7,lVar7,lVar12);
  }
  lVar7 = (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols * (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if (0 < lVar7) {
    plVar1 = (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    lVar12 = 0;
    do {
      plVar1[lVar12] = *(long *)(lVar18 + lVar12 * 8);
      lVar12 = lVar12 + 1;
    } while (lVar7 - lVar12 != 0);
  }
  sVar9 = (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  if (sVar9 == (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows) {
    this->dim_ = sVar9;
    local_40 = this_00;
    SVar21 = Eigen::
             MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>_>
             ::determinant((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,__1,_0,__1,__1>_>_>
                            *)&stack0xffffffffffffffc0);
    uVar8 = (ulong)(ABS(SVar21) + 0.5);
    this->num_cells_ =
         (long)((ABS(SVar21) + 0.5) - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
    local_40 = this_00;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&this->rs_,(SrcXprType *)&stack0xffffffffffffffc0,(assign_op<double,_double> *)&local_48);
    this_01 = &this->nmin_;
    if ((this->nmin_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != this->dim_) {
      Eigen::PlainObjectBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::resize
                (&this_01->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,this->dim_,1
                );
    }
    lVar18 = (this->nmin_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (0 < lVar18) {
      memset((this_01->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar18 << 3);
    }
    this_02 = &this->nmax_;
    if ((this->nmax_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != this->dim_) {
      Eigen::PlainObjectBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::resize
                (&this_02->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,this->dim_,1
                );
    }
    lVar18 = (this->nmax_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (0 < lVar18) {
      memset((this_02->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar18 << 3);
    }
    plVar1 = (this_00->super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    plVar2 = (this_01->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    plVar3 = (this_02->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar8 = 0;
    do {
      uVar17 = this->dim_;
      if (uVar17 != 0) {
        uVar16 = 0;
        plVar11 = plVar1;
        do {
          uVar19 = 0;
          lVar18 = 0;
          plVar20 = plVar11;
          do {
            if ((uVar8 >> (uVar19 & 0x3f) & 1) == 0) {
              lVar7 = 0;
            }
            else {
              lVar7 = *plVar20;
            }
            lVar18 = lVar18 + lVar7;
            uVar19 = uVar19 + 1;
            plVar20 = plVar20 + (this->span_).
                                super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows;
          } while (uVar17 + (uVar17 == 0) != uVar19);
          lVar7 = plVar2[uVar16];
          if (lVar18 < lVar7) {
            lVar7 = lVar18;
          }
          plVar2[uVar16] = lVar7;
          lVar7 = plVar3[uVar16];
          if (lVar18 < lVar7) {
            lVar18 = lVar7;
          }
          plVar3[uVar16] = lVar18;
          uVar16 = uVar16 + 1;
          uVar17 = this->dim_;
          plVar11 = plVar11 + 1;
        } while (uVar16 < uVar17);
      }
      sVar9 = this->dim_;
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)(long)(1 << ((byte)sVar9 & 0x1f)));
    if (sVar9 == 0) {
      __new_size = 1;
    }
    else {
      __new_size = 1;
      sVar15 = 0;
      do {
        __new_size = __new_size *
                     ((this_02->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data[sVar15] -
                     (this_01->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data[sVar15]);
        sVar15 = sVar15 + 1;
      } while (sVar9 != sVar15);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->lcord2index_,__new_size);
    puVar4 = (this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar4) {
      (this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish = puVar4;
    }
    local_48 = 0;
    if ((this->lcord2index_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->lcord2index_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      do {
        lcord2offset((supercell *)&stack0xffffffffffffffc0,(size_t)this);
        bVar6 = within_supercell(this,(offset_t *)&stack0xffffffffffffffc0);
        if (bVar6) {
          __position._M_current =
               (this->index2lcord_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (this->lcord2index_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[local_48] =
               (long)__position._M_current -
               (long)(this->index2lcord_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
          if (__position._M_current ==
              (this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->index2lcord_,
                       __position,&local_48);
          }
          else {
            *__position._M_current = local_48;
            (this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        free(local_40);
        local_48 = local_48 + 1;
      } while (local_48 <
               (ulong)((long)(this->lcord2index_).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->lcord2index_).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    sVar9 = (long)(this->index2lcord_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->index2lcord_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (this->num_cells_ == sVar9) {
      return (int)sVar9;
    }
    this_03 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_03,"supercell::init() internal error");
    puVar14 = &std::logic_error::typeinfo;
    pcVar13 = std::logic_error::~logic_error;
  }
  else {
    this_03 = (logic_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this_03,"invalid shape of span matrix");
    puVar14 = &std::invalid_argument::typeinfo;
    pcVar13 = std::invalid_argument::~invalid_argument;
  }
  __cxa_throw(this_03,puVar14,pcVar13);
}

Assistant:

void init(const span_t& span) {
    span_ = span;
    if (span_.cols() != span_.rows())
      throw std::invalid_argument("invalid shape of span matrix");
    dim_ = span_.cols();
    num_cells_ = std::size_t(std::abs(span_.cast<double>().determinant()) + 0.5);
    rs_ = span_.cast<double>().inverse();

    nmin_ = offset_t::Zero(dim_);
    nmax_ = offset_t::Zero(dim_);
    for (std::size_t i = 0; i < std::size_t(1 << dim_); ++i) {
      for (std::size_t m = 0; m < dim_; ++m) {
        long v = 0;
        for (std::size_t n = 0; n < dim_; ++n) v += ((i >> n) & 1) * span_(m, n);
        nmin_(m) = std::min(nmin_(m), v);
        nmax_(m) = std::max(nmax_(m), v);
      }
    }
    
    std::size_t lcord_max = 1;
    for (std::size_t m = 0; m < dim_; ++m) lcord_max *= (nmax_(m) - nmin_(m));
    lcord2index_.resize(lcord_max);
    index2lcord_.clear();
    for (std::size_t i = 0; i < lcord2index_.size(); ++i) {
      offset_t c = lcord2offset(i);
      if (within_supercell(c)) {
        lcord2index_[i] = index2lcord_.size();
        index2lcord_.push_back(i);
      }
    }
    if (num_cells_ != index2lcord_.size())
      throw std::logic_error("supercell::init() internal error");
  }